

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_batchcompute_get_job_description.cc
# Opt level: O2

int __thiscall
aliyun::BatchCompute::GetJobDescription
          (BatchCompute *this,BatchComputeGetJobDescriptionRequestType *req,
          BatchComputeGetJobDescriptionResponseType *response,BatchComputeErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  AliRoaRequest *this_00;
  Value *pVVar3;
  char *pcVar4;
  allocator<char> local_2d2;
  allocator<char> local_2d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  Value val;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string str_response;
  string url;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  pcVar4 = "http";
  if (this->use_tls_ != false) {
    pcVar4 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar4,(allocator<char> *)&url);
  std::operator+(&local_278,&secheme,"://");
  std::operator+(&local_2d0,&local_278,this->host_);
  get_format_string_abi_cxx11_
            (&local_298,"/jobs/%s/description",(req->resource_name)._M_dataplus._M_p);
  std::operator+(&url,&local_2d0,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_278);
  this_00 = (AliRoaRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,this->version_,(allocator<char> *)&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,this->appid_,(allocator<char> *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,this->secret_,(allocator<char> *)&local_298);
  std::__cxx11::string::string((string *)&local_1d8,(string *)&url);
  AliRoaRequest::AliRoaRequest(this_00,&local_178,&local_198,&local_1b8,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  if (((this->use_tls_ == false) && (pcVar4 = this->proxy_host_, pcVar4 != (char *)0x0)) &&
     (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,pcVar4,(allocator<char> *)&local_2d0);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"GET",(allocator<char> *)&local_2d0);
  AliHttpRequest::setRequestMethod((AliHttpRequest *)this_00,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (BatchComputeErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_2d0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,anon_var_dwarf_be243 + 9,(allocator<char> *)&local_278);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_2d0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,anon_var_dwarf_be243 + 9,(allocator<char> *)&local_298);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_2d0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,anon_var_dwarf_be243 + 9,&local_2d1);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_2d0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,anon_var_dwarf_be243 + 9,&local_2d2);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
      }
      goto LAB_00128e1a;
    }
  }
  iVar2 = -1;
  if (error_info != (BatchComputeErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00128e1a:
  AliRoaRequest::~AliRoaRequest(this_00);
  operator_delete(this_00,0x2c8);
  std::__cxx11::string::~string((string *)&url);
  std::__cxx11::string::~string((string *)&secheme);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int BatchCompute::GetJobDescription(const BatchComputeGetJobDescriptionRequestType& req,
                      BatchComputeGetJobDescriptionResponseType* response,
                      BatchComputeErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  Json::Value val;
  Json::Reader reader;
  std::string secheme = this->use_tls_ ? "https" : "http";
  std::string url = secheme  + "://" + host_ + get_format_string("/jobs/%s/description", req.resource_name.c_str());
  AliRoaRequest* req_rpc = new AliRoaRequest(version_,
                         appid_,
                         secret_,
                         url);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  req_rpc->setRequestMethod("GET");
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}